

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O1

void ns_mgr_free(ns_mgr *s)

{
  ns_connection *pnVar1;
  ns_connection *conn;
  
  if (s != (ns_mgr *)0x0) {
    ns_mgr_poll(s,0);
    if (s->ctl[0] != -1) {
      close(s->ctl[0]);
    }
    if (s->ctl[1] != -1) {
      close(s->ctl[1]);
    }
    s->ctl[0] = -1;
    s->ctl[1] = -1;
    conn = s->active_connections;
    while (conn != (ns_connection *)0x0) {
      pnVar1 = conn->next;
      ns_close_conn(conn);
      conn = pnVar1;
    }
  }
  return;
}

Assistant:

void ns_mgr_free(struct ns_mgr *s) {
  struct ns_connection *conn, *tmp_conn;

  DBG(("%p", s));
  if (s == NULL) return;
  // Do one last poll, see https://github.com/cesanta/mongoose/issues/286
  ns_mgr_poll(s, 0);

  if (s->ctl[0] != INVALID_SOCKET) closesocket(s->ctl[0]);
  if (s->ctl[1] != INVALID_SOCKET) closesocket(s->ctl[1]);
  s->ctl[0] = s->ctl[1] = INVALID_SOCKET;

  for (conn = s->active_connections; conn != NULL; conn = tmp_conn) {
    tmp_conn = conn->next;
    ns_close_conn(conn);
  }
}